

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::LRN_x86_avx512::forward_inplace(LRN_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  byte bVar15;
  byte bVar16;
  int *piVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  pointer piVar21;
  bool bVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  _func_int ***ppp_Var27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  float *pfVar31;
  _func_int ***ppp_Var32;
  uint uVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  LRN_x86_avx512 *pLVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  undefined1 (*pauVar41) [32];
  void *pvVar42;
  ushort uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  allocator_type local_209;
  undefined1 local_208 [12];
  float fStack_1fc;
  undefined4 local_1f8;
  int iStack_1f4;
  int local_1f0;
  Allocator *local_1e8;
  int iStack_1e0;
  float fStack_1dc;
  int iStack_1d8;
  int iStack_1d4;
  int iStack_1d0;
  size_t local_1c8;
  undefined8 local_1c0;
  Mat *local_1b8;
  LRN_x86_avx512 *local_1b0;
  ulong local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined4 local_188;
  int iStack_184;
  int local_180;
  Allocator *local_178;
  int iStack_170;
  float fStack_16c;
  undefined8 uStack_168;
  int local_160;
  size_t local_158;
  ulong local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  long local_128;
  Allocator *local_120;
  long local_118;
  void *local_110;
  long local_108;
  _func_int ***local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [64];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  local_148 = (float)bottom_top_blob->w;
  local_1c0 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  uVar38 = bottom_top_blob->c;
  uVar28 = (ulong)uVar38;
  _elemsize = bottom_top_blob->elemsize;
  local_158 = 0;
  local_198._0_8_ = (Allocator *)0x0;
  local_198._8_4_ = 0;
  local_198._12_4_ = 0.0;
  local_188 = 0;
  local_180 = 0;
  uStack_168 = SUB168(ZEXT816(0) << 0x40,4);
  fStack_144 = 0.0;
  local_1b0 = this;
  iStack_184 = local_198._8_4_;
  local_178 = (Allocator *)local_198._0_8_;
  iStack_170 = local_198._8_4_;
  fStack_16c = (float)local_198._12_4_;
  local_160 = local_180;
  Mat::create((Mat *)local_198,(int)local_148,bottom_top_blob->h,uVar38,_elemsize,
              opt->workspace_allocator);
  iVar24 = -100;
  if (((Allocator *)local_198._0_8_ == (Allocator *)0x0) || ((long)local_160 * local_158 == 0))
  goto LAB_003306e5;
  uVar33 = (int)local_1c0 * (int)local_148;
  if (0 < (int)uVar38) {
    uVar26 = 0;
    do {
      pfVar31 = (float *)(bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var27 = (_func_int ***)
                  ((long)(_func_int ***)local_198._0_8_ +
                  local_158 * uVar26 * CONCAT44(iStack_184,local_188));
      if ((int)uVar33 < 8) {
        uVar29 = 0;
      }
      else {
        iVar35 = 7;
        do {
          auVar64._4_4_ = pfVar31[1] * pfVar31[1];
          auVar64._0_4_ = *pfVar31 * *pfVar31;
          auVar64._8_4_ = pfVar31[2] * pfVar31[2];
          auVar64._12_4_ = pfVar31[3] * pfVar31[3];
          auVar64._16_4_ = pfVar31[4] * pfVar31[4];
          auVar64._20_4_ = pfVar31[5] * pfVar31[5];
          auVar64._24_4_ = pfVar31[6] * pfVar31[6];
          auVar64._28_4_ = pfVar31[7];
          *(undefined1 (*) [32])ppp_Var27 = auVar64;
          pfVar31 = pfVar31 + 8;
          ppp_Var27 = ppp_Var27 + 4;
          iVar35 = iVar35 + 8;
          uVar29 = uVar33 & 0xfffffff8;
        } while (iVar35 < (int)uVar33);
      }
      if (uVar33 - uVar29 != 0 && (int)uVar29 <= (int)uVar33) {
        lVar39 = 0;
        do {
          *(float *)((long)ppp_Var27 + lVar39 * 4) = pfVar31[lVar39] * pfVar31[lVar39];
          lVar39 = lVar39 + 1;
        } while (uVar33 - uVar29 != (int)lVar39);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar28);
  }
  iVar35 = (local_1b0->super_LRN).region_type;
  local_1b8 = bottom_top_blob;
  local_150 = uVar28;
  if (iVar35 == 0) {
    local_1c8 = 0;
    local_208._0_8_ = (Allocator *)0x0;
    local_208._8_4_ = 0;
    fStack_1fc = 0.0;
    local_1f8 = 0;
    iStack_1f4 = 0;
    local_1f0 = 0;
    local_1e8 = (Allocator *)0x0;
    iStack_1e0 = 0;
    fStack_1dc = 0.0;
    iStack_1d8 = 0;
    iStack_1d4 = 0;
    iStack_1d0 = 0;
    Mat::create((Mat *)local_208,(int)local_148,(int)local_1c0,uVar38,_elemsize,
                opt->workspace_allocator);
    bVar22 = (Allocator *)local_208._0_8_ == (Allocator *)0x0 || (long)iStack_1d0 * local_1c8 == 0;
    if (bVar22) {
      piVar17 = (int *)CONCAT44(fStack_1fc,local_208._8_4_);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_1e8 == (Allocator *)0x0) {
joined_r0x0033066a:
            if ((Allocator *)local_208._0_8_ != (Allocator *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
      }
LAB_003306bd:
      local_1c8 = 0;
      local_208._0_8_ = (void *)0x0;
      local_208._8_4_ = 0;
      fStack_1fc = 0.0;
      local_1f8 = 0;
      iStack_1f4 = 0;
      local_1f0 = 0;
      iStack_1e0 = 0;
      fStack_1dc = 0.0;
      iStack_1d8 = 0;
      iStack_1d4 = 0;
      iStack_1d0 = 0;
      goto LAB_003306e5;
    }
    local_1a0 = CONCAT71(local_1a0._1_7_,bVar22);
    if (0 < iStack_1d0 * (int)local_1c8) {
      memset((void *)local_208._0_8_,0,(ulong)(uint)(iStack_1d0 * (int)local_1c8) << 2);
    }
    if (0 < (int)uVar38) {
      local_f8 = (local_1b0->super_LRN).alpha / (float)(local_1b0->super_LRN).local_size;
      auVar65 = ZEXT1664(ZEXT416((uint)local_f8));
      uVar26 = 0;
      auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      local_1c0 = (Mat *)(CONCAT44(local_1c0._4_4_,uVar33) & 0xfffffffffffffff8);
      local_b8._0_16_ = ZEXT416((uint)local_f8);
      pLVar37 = local_1b0;
      uVar38 = uVar33 & 0xfffffff8;
      fStack_f4 = local_f8;
      fStack_f0 = local_f8;
      fStack_ec = local_f8;
      fStack_e8 = local_f8;
      fStack_e4 = local_f8;
      fStack_e0 = local_f8;
      fStack_dc = local_f8;
      do {
        auVar85._8_4_ = 0x3f3504f3;
        auVar85._0_8_ = 0x3f3504f33f3504f3;
        auVar56._8_4_ = 0xffffff82;
        auVar56._0_8_ = 0xffffff82ffffff82;
        auVar84._8_4_ = 0x39506967;
        auVar84._0_8_ = 0x3950696739506967;
        auVar61._8_4_ = 0x3f800000;
        auVar61._0_8_ = 0x3f8000003f800000;
        auVar83._8_4_ = 0x3e2aaaaa;
        auVar83._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar82._8_4_ = 0x800000;
        auVar82._0_8_ = 0x80000000800000;
        auVar81._8_4_ = 0x3d2aa9c1;
        auVar81._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar80._8_4_ = 0x3c088908;
        auVar80._0_8_ = 0x3c0889083c088908;
        auVar79._8_4_ = 0x3ab743ce;
        auVar79._0_8_ = 0x3ab743ce3ab743ce;
        auVar77._8_4_ = 0x3fb8aa3b;
        auVar77._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar75._8_4_ = 0xc2b0c0a5;
        auVar75._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar73._8_4_ = 0x42b0c0a5;
        auVar73._0_8_ = 0x42b0c0a542b0c0a5;
        auVar85._12_4_ = 0x3f3504f3;
        auVar56._12_4_ = 0xffffff82;
        auVar84._12_4_ = 0x39506967;
        auVar61._12_4_ = 0x3f800000;
        auVar83._12_4_ = 0x3e2aaaaa;
        auVar82._12_4_ = 0x800000;
        auVar81._12_4_ = 0x3d2aa9c1;
        auVar80._12_4_ = 0x3c088908;
        auVar79._12_4_ = 0x3ab743ce;
        auVar77._12_4_ = 0x3fb8aa3b;
        auVar75._12_4_ = 0xc2b0c0a5;
        auVar73._12_4_ = 0x42b0c0a5;
        auVar85._16_4_ = 0x3f3504f3;
        auVar56._16_4_ = 0xffffff82;
        auVar84._16_4_ = 0x39506967;
        auVar61._16_4_ = 0x3f800000;
        auVar83._16_4_ = 0x3e2aaaaa;
        auVar82._16_4_ = 0x800000;
        auVar81._16_4_ = 0x3d2aa9c1;
        auVar80._16_4_ = 0x3c088908;
        auVar79._16_4_ = 0x3ab743ce;
        auVar77._16_4_ = 0x3fb8aa3b;
        auVar75._16_4_ = 0xc2b0c0a5;
        auVar73._16_4_ = 0x42b0c0a5;
        auVar85._20_4_ = 0x3f3504f3;
        auVar56._20_4_ = 0xffffff82;
        auVar84._20_4_ = 0x39506967;
        auVar61._20_4_ = 0x3f800000;
        auVar83._20_4_ = 0x3e2aaaaa;
        auVar82._20_4_ = 0x800000;
        auVar81._20_4_ = 0x3d2aa9c1;
        auVar80._20_4_ = 0x3c088908;
        auVar79._20_4_ = 0x3ab743ce;
        auVar77._20_4_ = 0x3fb8aa3b;
        auVar75._20_4_ = 0xc2b0c0a5;
        auVar73._20_4_ = 0x42b0c0a5;
        auVar85._24_4_ = 0x3f3504f3;
        auVar56._24_4_ = 0xffffff82;
        auVar84._24_4_ = 0x39506967;
        auVar61._24_4_ = 0x3f800000;
        auVar83._24_4_ = 0x3e2aaaaa;
        auVar82._24_4_ = 0x800000;
        auVar81._24_4_ = 0x3d2aa9c1;
        auVar80._24_4_ = 0x3c088908;
        auVar79._24_4_ = 0x3ab743ce;
        auVar77._24_4_ = 0x3fb8aa3b;
        auVar75._24_4_ = 0xc2b0c0a5;
        auVar73._24_4_ = 0x42b0c0a5;
        auVar85._28_4_ = 0x3f3504f3;
        auVar56._28_4_ = 0xffffff82;
        auVar84._28_4_ = 0x39506967;
        auVar61._28_4_ = 0x3f800000;
        auVar83._28_4_ = 0x3e2aaaaa;
        auVar82._28_4_ = 0x800000;
        auVar81._28_4_ = 0x3d2aa9c1;
        auVar80._28_4_ = 0x3c088908;
        auVar79._28_4_ = 0x3ab743ce;
        auVar77._28_4_ = 0x3fb8aa3b;
        auVar75._28_4_ = 0xc2b0c0a5;
        auVar73._28_4_ = 0x42b0c0a5;
        iVar24 = (pLVar37->super_LRN).local_size / 2;
        iVar35 = (int)uVar26;
        uVar29 = iVar35 - iVar24;
        if ((int)uVar29 <= iVar24 + iVar35) {
          do {
            if (uVar29 < (uint)uVar28) {
              ppp_Var27 = (_func_int ***)
                          ((long)(_func_int ***)local_198._0_8_ +
                          uVar29 * local_158 * CONCAT44(iStack_184,local_188));
              ppp_Var32 = (_func_int ***)
                          ((long)(_func_int ***)local_208._0_8_ +
                          local_1c8 * uVar26 * CONCAT44(iStack_1f4,local_1f8));
              uVar36 = 0;
              if (7 < (int)uVar33) {
                iVar24 = 7;
                do {
                  auVar55._0_4_ = *(float *)ppp_Var32 + *(float *)ppp_Var27;
                  auVar55._4_4_ = *(float *)((long)ppp_Var32 + 4) + *(float *)((long)ppp_Var27 + 4);
                  auVar55._8_4_ = *(float *)(ppp_Var32 + 1) + *(float *)(ppp_Var27 + 1);
                  auVar55._12_4_ =
                       *(float *)((long)(ppp_Var32 + 1) + 4) + *(float *)((long)(ppp_Var27 + 1) + 4)
                  ;
                  auVar55._16_4_ = *(float *)(ppp_Var32 + 2) + *(float *)(ppp_Var27 + 2);
                  auVar55._20_4_ =
                       *(float *)((long)(ppp_Var32 + 2) + 4) + *(float *)((long)(ppp_Var27 + 2) + 4)
                  ;
                  auVar55._24_4_ = *(float *)(ppp_Var32 + 3) + *(float *)(ppp_Var27 + 3);
                  auVar55._28_4_ =
                       *(float *)((long)(ppp_Var32 + 3) + 4) + *(float *)((long)(ppp_Var27 + 3) + 4)
                  ;
                  *(undefined1 (*) [32])ppp_Var32 = auVar55;
                  ppp_Var27 = ppp_Var27 + 4;
                  ppp_Var32 = ppp_Var32 + 4;
                  iVar24 = iVar24 + 8;
                  uVar36 = uVar38;
                } while (iVar24 < (int)uVar33);
              }
              if (uVar33 - uVar36 != 0 && (int)uVar36 <= (int)uVar33) {
                lVar39 = 0;
                do {
                  *(float *)((long)ppp_Var32 + lVar39 * 4) =
                       *(float *)((long)ppp_Var32 + lVar39 * 4) +
                       *(float *)((long)ppp_Var27 + lVar39 * 4);
                  lVar39 = lVar39 + 1;
                } while (uVar33 - uVar36 != (int)lVar39);
              }
            }
            bVar22 = (int)uVar29 < (pLVar37->super_LRN).local_size / 2 + iVar35;
            uVar29 = uVar29 + 1;
          } while (bVar22);
        }
        pauVar41 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        ppp_Var27 = (_func_int ***)
                    ((long)(_func_int ***)local_208._0_8_ +
                    local_1c8 * uVar26 * CONCAT44(iStack_1f4,local_1f8));
        uVar29 = 0;
        if (7 < (int)uVar33) {
          local_148 = (pLVar37->super_LRN).bias;
          local_d8 = -(pLVar37->super_LRN).beta;
          iVar24 = 7;
          auVar55 = vmovdqa64_avx512vl(auVar61);
          auVar56 = vmovdqa64_avx512vl(auVar56);
          auVar57 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
          auVar61 = auVar80;
          do {
            auVar19._4_4_ = fStack_f4;
            auVar19._0_4_ = local_f8;
            auVar19._8_4_ = fStack_f0;
            auVar19._12_4_ = fStack_ec;
            auVar19._16_4_ = fStack_e8;
            auVar19._20_4_ = fStack_e4;
            auVar19._24_4_ = fStack_e0;
            auVar19._28_4_ = fStack_dc;
            auVar18._4_4_ = local_148;
            auVar18._0_4_ = local_148;
            auVar18._8_4_ = local_148;
            auVar18._12_4_ = local_148;
            auVar18._16_4_ = local_148;
            auVar18._20_4_ = local_148;
            auVar18._24_4_ = local_148;
            auVar18._28_4_ = local_148;
            auVar8 = vfmadd213ps_fma(*(undefined1 (*) [32])ppp_Var27,auVar19,auVar18);
            auVar58 = vmaxps_avx(auVar82,ZEXT1632(auVar8));
            auVar78 = vpsrld_avx2(auVar58,0x17);
            auVar58 = vpternlogd_avx512vl(auVar58,auVar45,auVar57,0xec);
            uVar28 = vcmpps_avx512vl(auVar58,auVar85,1);
            auVar59 = vaddps_avx512vl(auVar58,auVar46);
            auVar58 = vaddps_avx512vl(auVar59,auVar58);
            bVar22 = (bool)((byte)uVar28 & 1);
            auVar60._0_4_ = (float)((uint)bVar22 * auVar58._0_4_ | (uint)!bVar22 * auVar59._0_4_);
            bVar22 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar60._4_4_ = (float)((uint)bVar22 * auVar58._4_4_ | (uint)!bVar22 * auVar59._4_4_);
            bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar60._8_4_ = (float)((uint)bVar22 * auVar58._8_4_ | (uint)!bVar22 * auVar59._8_4_);
            bVar22 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar60._12_4_ = (float)((uint)bVar22 * auVar58._12_4_ | (uint)!bVar22 * auVar59._12_4_)
            ;
            bVar22 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar60._16_4_ = (float)((uint)bVar22 * auVar58._16_4_ | (uint)!bVar22 * auVar59._16_4_)
            ;
            bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar60._20_4_ = (float)((uint)bVar22 * auVar58._20_4_ | (uint)!bVar22 * auVar59._20_4_)
            ;
            bVar22 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar60._24_4_ = (float)((uint)bVar22 * auVar58._24_4_ | (uint)!bVar22 * auVar59._24_4_)
            ;
            bVar22 = SUB81(uVar28 >> 7,0);
            auVar60._28_4_ = (uint)bVar22 * auVar58._28_4_ | (uint)!bVar22 * auVar59._28_4_;
            auVar76._8_4_ = 0x3d9021bb;
            auVar76._0_8_ = 0x3d9021bb3d9021bb;
            auVar76._12_4_ = 0x3d9021bb;
            auVar76._16_4_ = 0x3d9021bb;
            auVar76._20_4_ = 0x3d9021bb;
            auVar76._24_4_ = 0x3d9021bb;
            auVar76._28_4_ = 0x3d9021bb;
            auVar59 = vfmadd213ps_avx512vl(auVar76,auVar60,auVar48);
            auVar58._8_4_ = 0x3def251a;
            auVar58._0_8_ = 0x3def251a3def251a;
            auVar58._12_4_ = 0x3def251a;
            auVar58._16_4_ = 0x3def251a;
            auVar58._20_4_ = 0x3def251a;
            auVar58._24_4_ = 0x3def251a;
            auVar58._28_4_ = 0x3def251a;
            auVar58 = vfmadd213ps_avx512vl(auVar59,auVar60,auVar58);
            auVar59._8_4_ = 0xbdfe5d4f;
            auVar59._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar59._12_4_ = 0xbdfe5d4f;
            auVar59._16_4_ = 0xbdfe5d4f;
            auVar59._20_4_ = 0xbdfe5d4f;
            auVar59._24_4_ = 0xbdfe5d4f;
            auVar59._28_4_ = 0xbdfe5d4f;
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar60,auVar59);
            auVar44 = vfmadd213ps_fma(auVar58,auVar60,auVar49);
            auVar20._4_4_ = auVar60._4_4_ * auVar60._4_4_;
            auVar20._0_4_ = auVar60._0_4_ * auVar60._0_4_;
            auVar20._8_4_ = auVar60._8_4_ * auVar60._8_4_;
            auVar20._12_4_ = auVar60._12_4_ * auVar60._12_4_;
            auVar20._16_4_ = auVar60._16_4_ * auVar60._16_4_;
            auVar20._20_4_ = auVar60._20_4_ * auVar60._20_4_;
            auVar20._24_4_ = auVar60._24_4_ * auVar60._24_4_;
            auVar20._28_4_ = auVar61._28_4_;
            auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar60,auVar50);
            auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar44),auVar60,auVar51);
            auVar61 = vfmadd213ps_avx512vl(auVar61,auVar60,auVar52);
            auVar11._8_4_ = 0x3eaaaaaa;
            auVar11._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar11._12_4_ = 0x3eaaaaaa;
            auVar11._16_4_ = 0x3eaaaaaa;
            auVar11._20_4_ = 0x3eaaaaaa;
            auVar11._24_4_ = 0x3eaaaaaa;
            auVar11._28_4_ = 0x3eaaaaaa;
            auVar61 = vfmadd213ps_avx512vl(auVar61,auVar60,auVar11);
            auVar12._4_4_ = auVar60._4_4_ * auVar60._4_4_ * auVar60._4_4_ * auVar61._4_4_;
            auVar12._0_4_ = auVar60._0_4_ * auVar60._0_4_ * auVar60._0_4_ * auVar61._0_4_;
            auVar12._8_4_ = auVar60._8_4_ * auVar60._8_4_ * auVar60._8_4_ * auVar61._8_4_;
            auVar12._12_4_ = auVar60._12_4_ * auVar60._12_4_ * auVar60._12_4_ * auVar61._12_4_;
            auVar12._16_4_ = auVar60._16_4_ * auVar60._16_4_ * auVar60._16_4_ * auVar61._16_4_;
            auVar12._20_4_ = auVar60._20_4_ * auVar60._20_4_ * auVar60._20_4_ * auVar61._20_4_;
            auVar12._24_4_ = auVar60._24_4_ * auVar60._24_4_ * auVar60._24_4_ * auVar61._24_4_;
            auVar12._28_4_ = auVar61._28_4_;
            auVar61 = vpaddd_avx512vl(auVar78,auVar56);
            auVar61 = vcvtdq2ps_avx(auVar61);
            auVar58 = vsubps_avx512vl(auVar61,auVar47);
            bVar22 = (bool)((byte)uVar28 & 1);
            auVar62._0_4_ = (uint)bVar22 * auVar58._0_4_ | (uint)!bVar22 * auVar61._0_4_;
            bVar22 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar22 * auVar58._4_4_ | (uint)!bVar22 * auVar61._4_4_;
            bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar22 * auVar58._8_4_ | (uint)!bVar22 * auVar61._8_4_;
            bVar22 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar22 * auVar58._12_4_ | (uint)!bVar22 * auVar61._12_4_;
            bVar22 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar22 * auVar58._16_4_ | (uint)!bVar22 * auVar61._16_4_;
            bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar22 * auVar58._20_4_ | (uint)!bVar22 * auVar61._20_4_;
            bVar22 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar22 * auVar58._24_4_ | (uint)!bVar22 * auVar61._24_4_;
            bVar22 = SUB81(uVar28 >> 7,0);
            auVar62._28_4_ = (uint)bVar22 * auVar58._28_4_ | (uint)!bVar22 * auVar61._28_4_;
            auVar61 = vfmadd231ps_avx512vl(auVar12,auVar62,auVar53);
            auVar58 = vfmsub231ps_avx512vl(auVar61,auVar54,auVar20);
            uVar28 = vcmpps_avx512vl(ZEXT1632(auVar8),_DAT_005f3260,2);
            auVar61 = vsubps_avx(auVar58,auVar60);
            auVar59 = vfmsub231ps_avx512vl(auVar61,auVar64,auVar62);
            auVar61 = vpcmpeqd_avx2(auVar58,auVar58);
            bVar22 = (bool)((byte)uVar28 & 1);
            bVar1 = (bool)((byte)(uVar28 >> 1) & 1);
            bVar2 = (bool)((byte)(uVar28 >> 2) & 1);
            bVar3 = (bool)((byte)(uVar28 >> 3) & 1);
            bVar4 = (bool)((byte)(uVar28 >> 4) & 1);
            bVar5 = (bool)((byte)(uVar28 >> 5) & 1);
            bVar6 = (bool)((byte)(uVar28 >> 6) & 1);
            bVar7 = SUB81(uVar28 >> 7,0);
            auVar78._4_4_ =
                 (float)((uint)bVar1 * auVar61._4_4_ | (uint)!bVar1 * auVar59._4_4_) * local_d8;
            auVar78._0_4_ =
                 (float)((uint)bVar22 * auVar61._0_4_ | (uint)!bVar22 * auVar59._0_4_) * local_d8;
            auVar78._8_4_ =
                 (float)((uint)bVar2 * auVar61._8_4_ | (uint)!bVar2 * auVar59._8_4_) * local_d8;
            auVar78._12_4_ =
                 (float)((uint)bVar3 * auVar61._12_4_ | (uint)!bVar3 * auVar59._12_4_) * local_d8;
            auVar78._16_4_ =
                 (float)((uint)bVar4 * auVar61._16_4_ | (uint)!bVar4 * auVar59._16_4_) * local_d8;
            auVar78._20_4_ =
                 (float)((uint)bVar5 * auVar61._20_4_ | (uint)!bVar5 * auVar59._20_4_) * local_d8;
            auVar78._24_4_ =
                 (float)((uint)bVar6 * auVar61._24_4_ | (uint)!bVar6 * auVar59._24_4_) * local_d8;
            auVar78._28_4_ = (uint)bVar7 * auVar61._28_4_ | (uint)!bVar7 * auVar59._28_4_;
            auVar61 = vminps_avx512vl(auVar78,auVar73);
            auVar61 = vmaxps_avx(auVar75,auVar61);
            auVar8 = vfmadd231ps_fma(auVar54,auVar61,auVar77);
            auVar58 = vroundps_avx(ZEXT1632(auVar8),1);
            uVar28 = vcmpps_avx512vl(ZEXT1632(auVar8),auVar58,1);
            auVar59 = vsubps_avx512vl(auVar58,auVar47);
            bVar22 = (bool)((byte)uVar28 & 1);
            auVar63._0_4_ = (float)((uint)bVar22 * auVar59._0_4_ | (uint)!bVar22 * auVar58._0_4_);
            bVar22 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar63._4_4_ = (float)((uint)bVar22 * auVar59._4_4_ | (uint)!bVar22 * auVar58._4_4_);
            bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar63._8_4_ = (float)((uint)bVar22 * auVar59._8_4_ | (uint)!bVar22 * auVar58._8_4_);
            bVar22 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar63._12_4_ = (float)((uint)bVar22 * auVar59._12_4_ | (uint)!bVar22 * auVar58._12_4_)
            ;
            bVar22 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar63._16_4_ = (float)((uint)bVar22 * auVar59._16_4_ | (uint)!bVar22 * auVar58._16_4_)
            ;
            bVar22 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar63._20_4_ = (float)((uint)bVar22 * auVar59._20_4_ | (uint)!bVar22 * auVar58._20_4_)
            ;
            bVar22 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar63._24_4_ = (float)((uint)bVar22 * auVar59._24_4_ | (uint)!bVar22 * auVar58._24_4_)
            ;
            bVar22 = SUB81(uVar28 >> 7,0);
            auVar63._28_4_ = (float)((uint)bVar22 * auVar59._28_4_ | (uint)!bVar22 * auVar58._28_4_)
            ;
            auVar61 = vfmsub231ps_avx512vl(auVar61,auVar63,auVar64);
            auVar61 = vfnmsub231ps_avx512vl(auVar61,auVar63,auVar53);
            auVar8 = vfmadd213ps_fma(auVar84,auVar61,auVar79);
            auVar13._4_4_ = auVar61._4_4_ * auVar61._4_4_;
            auVar13._0_4_ = auVar61._0_4_ * auVar61._0_4_;
            auVar13._8_4_ = auVar61._8_4_ * auVar61._8_4_;
            auVar13._12_4_ = auVar61._12_4_ * auVar61._12_4_;
            auVar13._16_4_ = auVar61._16_4_ * auVar61._16_4_;
            auVar13._20_4_ = auVar61._20_4_ * auVar61._20_4_;
            auVar13._24_4_ = auVar61._24_4_ * auVar61._24_4_;
            auVar13._28_4_ = auVar60._28_4_;
            auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar61,auVar80);
            auVar58 = vfmadd213ps_avx512vl(ZEXT1632(auVar8),auVar61,auVar81);
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar83);
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar61,auVar54);
            auVar8 = vfmadd213ps_fma(auVar58,auVar13,auVar61);
            auVar74._0_4_ = (int)auVar63._0_4_;
            auVar74._4_4_ = (int)auVar63._4_4_;
            auVar74._8_4_ = (int)auVar63._8_4_;
            auVar74._12_4_ = (int)auVar63._12_4_;
            auVar74._16_4_ = (int)auVar63._16_4_;
            auVar74._20_4_ = (int)auVar63._20_4_;
            auVar74._24_4_ = (int)auVar63._24_4_;
            auVar74._28_4_ = (int)auVar63._28_4_;
            auVar61 = vpslld_avx2(auVar74,0x17);
            auVar61 = vpaddd_avx512vl(auVar61,auVar55);
            auVar14._4_4_ = auVar61._4_4_ * *(float *)((long)*pauVar41 + 4);
            auVar14._0_4_ = auVar61._0_4_ * *(float *)*pauVar41;
            auVar14._8_4_ = auVar61._8_4_ * *(float *)((long)*pauVar41 + 8);
            auVar14._12_4_ = auVar61._12_4_ * *(float *)((long)*pauVar41 + 0xc);
            auVar14._16_4_ = auVar61._16_4_ * *(float *)((long)*pauVar41 + 0x10);
            auVar14._20_4_ = auVar61._20_4_ * *(float *)((long)*pauVar41 + 0x14);
            auVar14._24_4_ = auVar61._24_4_ * *(float *)((long)*pauVar41 + 0x18);
            auVar14._28_4_ = auVar61._28_4_;
            auVar8 = vfmadd213ps_fma(auVar14,ZEXT1632(auVar8),auVar14);
            *pauVar41 = ZEXT1632(auVar8);
            ppp_Var27 = ppp_Var27 + 4;
            pauVar41 = pauVar41 + 1;
            iVar24 = iVar24 + 8;
            uVar29 = uVar38;
            fStack_144 = local_148;
            fStack_140 = local_148;
            fStack_13c = local_148;
            fStack_138 = local_148;
            fStack_134 = local_148;
            fStack_130 = local_148;
            fStack_12c = local_148;
            fStack_d4 = local_d8;
            fStack_d0 = local_d8;
            fStack_cc = local_d8;
            fStack_c8 = local_d8;
            fStack_c4 = local_d8;
            fStack_c0 = local_d8;
            fStack_bc = local_d8;
            auVar61 = auVar20;
          } while (iVar24 < (int)uVar33);
        }
        if (uVar33 - uVar29 != 0 && (int)uVar29 <= (int)uVar33) {
          lVar39 = 0;
          do {
            auVar8 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)ppp_Var27 + lVar39 * 4)),auVar65._0_16_
                                     ,ZEXT416((uint)(pLVar37->super_LRN).bias));
            fVar70 = powf(auVar8._0_4_,-(pLVar37->super_LRN).beta);
            auVar65 = ZEXT1664(local_b8._0_16_);
            *(float *)((long)*pauVar41 + lVar39 * 4) =
                 fVar70 * *(float *)((long)*pauVar41 + lVar39 * 4);
            lVar39 = lVar39 + 1;
            pLVar37 = local_1b0;
          } while (uVar33 - uVar29 != (int)lVar39);
        }
        uVar26 = uVar26 + 1;
        auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        uVar28 = local_150;
        bottom_top_blob = local_1b8;
        uVar38 = (uint)local_1c0;
      } while (uVar26 != local_150);
    }
    piVar17 = (int *)CONCAT44(fStack_1fc,local_208._8_4_);
    iVar24 = -100;
    if (piVar17 != (int *)0x0) {
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        if (local_1e8 == (Allocator *)0x0) {
          if ((Allocator *)local_208._0_8_ != (Allocator *)0x0) {
            free((void *)local_208._0_8_);
          }
        }
        else {
          (*local_1e8->_vptr_Allocator[3])();
        }
      }
    }
    local_1c8 = 0;
    local_208._0_8_ = (void *)0x0;
    local_208._8_4_ = 0;
    fStack_1fc = 0.0;
    local_1f8 = 0;
    iStack_1f4 = 0;
    local_1f0 = 0;
    iStack_1e0 = 0;
    fStack_1dc = 0.0;
    iStack_1d8 = 0;
    iStack_1d4 = 0;
    iStack_1d0 = 0;
    if ((char)local_1a0 != '\0') goto LAB_003306e5;
  }
  else if (iVar35 == 1) {
    piVar17 = (int *)CONCAT44(local_198._12_4_,local_198._8_4_);
    local_208._0_8_ = local_198._0_8_;
    local_208._8_4_ = local_198._8_4_;
    fStack_1fc = (float)local_198._12_4_;
    local_1f8 = local_188;
    iStack_1f4 = iStack_184;
    local_1f0 = local_180;
    local_1e8 = local_178;
    iStack_1e0 = iStack_170;
    fStack_1dc = fStack_16c;
    iStack_1d8 = (int)uStack_168;
    iStack_1d4 = SUB84(uStack_168,4);
    iStack_1d0 = local_160;
    local_1c8 = local_158;
    if (piVar17 != (int *)0x0) {
      LOCK();
      *piVar17 = *piVar17 + 1;
      UNLOCK();
    }
    uVar33 = (local_1b0->super_LRN).local_size;
    fVar70 = local_148;
    if (1 < (int)uVar33) {
      uVar29 = uVar33 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border((Mat *)local_198,(Mat *)local_208,uVar29,~uVar29 + uVar33,uVar29,
                       ~uVar29 + uVar33,0,0.0,(Option *)&_space_ofs);
      fVar70 = fStack_1dc;
      if ((Allocator *)local_208._0_8_ == (Allocator *)0x0 || (long)iStack_1d0 * local_1c8 == 0) {
        piVar17 = (int *)CONCAT44(fStack_1fc,local_208._8_4_);
        if (piVar17 != (int *)0x0) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (local_1e8 == (Allocator *)0x0) goto joined_r0x0033066a;
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
        goto LAB_003306bd;
      }
    }
    pLVar37 = local_1b0;
    iVar24 = (local_1b0->super_LRN).local_size;
    local_b8._0_8_ = CONCAT44(0,iVar24 * iVar24);
    local_d8 = (local_1b0->super_LRN).alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,local_b8._0_8_,&local_209);
    piVar21 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar35 = (pLVar37->super_LRN).local_size;
    if (0 < iVar35) {
      iVar23 = 0;
      iVar25 = 0;
      iVar30 = 0;
      do {
        if (0 < (pLVar37->super_LRN).local_size) {
          lVar39 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar30 + lVar39] = iVar25 + (int)lVar39;
            lVar39 = lVar39 + 1;
            iVar34 = (int)lVar39;
          } while (iVar34 < (pLVar37->super_LRN).local_size);
          iVar30 = iVar30 + iVar34;
          iVar25 = iVar25 + iVar34;
        }
        iVar25 = iVar25 + ((int)fVar70 - iVar35);
        iVar23 = iVar23 + 1;
      } while (iVar23 < (pLVar37->super_LRN).local_size);
    }
    if (0 < (int)uVar38) {
      local_1a0 = (long)(int)local_148;
      iVar35 = local_b8._0_4_;
      local_110 = local_1b8->data;
      local_118 = local_1b8->cstep * local_1b8->elemsize;
      local_120 = (Allocator *)local_208._0_8_;
      local_128 = local_1c8 * CONCAT44(iStack_1f4,local_1f8);
      local_108 = (long)(int)fStack_1dc * CONCAT44(iStack_1f4,local_1f8);
      auVar65 = vpbroadcastq_avx512f();
      local_f8 = 1.0 / (float)iVar35;
      local_1a8 = 0;
      auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_b8 = vmovdqu64_avx512f(auVar65);
      do {
        if (0 < (int)(uint)local_1c0) {
          local_100 = (_func_int ***)((long)&local_120->_vptr_Allocator + local_128 * local_1a8);
          pvVar42 = (void *)(local_118 * local_1a8 + (long)local_110);
          local_1b8 = (Mat *)0x0;
          do {
            ppp_Var27 = local_100;
            if (0 < (int)local_148) {
              lVar39 = local_108 * (long)local_1b8;
              lVar40 = 0;
              do {
                if (iVar24 == 0) {
                  fVar70 = 0.0;
                }
                else {
                  uVar28 = 0;
                  auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                  do {
                    auVar72 = auVar68;
                    auVar68 = vpbroadcastq_avx512f();
                    auVar69 = vporq_avx512f(auVar68,auVar66);
                    auVar68 = vporq_avx512f(auVar68,auVar67);
                    uVar9 = vpcmpuq_avx512f(auVar68,auVar65,2);
                    bVar15 = (byte)uVar9;
                    uVar9 = vpcmpuq_avx512f(auVar69,auVar65,2);
                    bVar16 = (byte)uVar9;
                    uVar43 = CONCAT11(bVar16,bVar15);
                    vmovdqu32_avx512f(*(undefined1 (*) [64])(piVar21 + uVar28));
                    auVar68 = vgatherdps_avx512f(*(undefined4 *)
                                                  ((long)ppp_Var27 +
                                                  uVar28 * 4 + lVar40 * 4 + lVar39));
                    auVar69._4_4_ = (uint)((byte)(uVar43 >> 1) & 1) * auVar68._4_4_;
                    auVar69._0_4_ = (uint)(bVar15 & 1) * auVar68._0_4_;
                    auVar69._8_4_ = (uint)((byte)(uVar43 >> 2) & 1) * auVar68._8_4_;
                    auVar69._12_4_ = (uint)((byte)(uVar43 >> 3) & 1) * auVar68._12_4_;
                    auVar69._16_4_ = (uint)((byte)(uVar43 >> 4) & 1) * auVar68._16_4_;
                    auVar69._20_4_ = (uint)((byte)(uVar43 >> 5) & 1) * auVar68._20_4_;
                    auVar69._24_4_ = (uint)((byte)(uVar43 >> 6) & 1) * auVar68._24_4_;
                    auVar69._28_4_ = (uint)((byte)(uVar43 >> 7) & 1) * auVar68._28_4_;
                    auVar69._32_4_ = (uint)(bVar16 & 1) * auVar68._32_4_;
                    auVar69._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar68._36_4_;
                    auVar69._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar68._40_4_;
                    auVar69._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar68._44_4_;
                    auVar69._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar68._48_4_;
                    auVar69._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar68._52_4_;
                    auVar69._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar68._56_4_;
                    auVar69._60_4_ = (uint)(bVar16 >> 7) * auVar68._60_4_;
                    auVar68 = vaddps_avx512f(auVar69,auVar72);
                    uVar28 = uVar28 + 0x10;
                  } while ((iVar35 + (uint)(iVar35 == 0) + 0xf & 0xfffffff0) != uVar28);
                  auVar65._0_4_ =
                       (uint)(bVar15 & 1) * auVar68._0_4_ |
                       (uint)!(bool)(bVar15 & 1) * auVar72._0_4_;
                  bVar22 = (bool)((byte)(uVar43 >> 1) & 1);
                  auVar65._4_4_ = (uint)bVar22 * auVar68._4_4_ | (uint)!bVar22 * auVar72._4_4_;
                  bVar22 = (bool)((byte)(uVar43 >> 2) & 1);
                  auVar65._8_4_ = (uint)bVar22 * auVar68._8_4_ | (uint)!bVar22 * auVar72._8_4_;
                  bVar22 = (bool)((byte)(uVar43 >> 3) & 1);
                  auVar65._12_4_ = (uint)bVar22 * auVar68._12_4_ | (uint)!bVar22 * auVar72._12_4_;
                  bVar22 = (bool)((byte)(uVar43 >> 4) & 1);
                  auVar65._16_4_ = (uint)bVar22 * auVar68._16_4_ | (uint)!bVar22 * auVar72._16_4_;
                  bVar22 = (bool)((byte)(uVar43 >> 5) & 1);
                  auVar65._20_4_ = (uint)bVar22 * auVar68._20_4_ | (uint)!bVar22 * auVar72._20_4_;
                  bVar22 = (bool)((byte)(uVar43 >> 6) & 1);
                  auVar65._24_4_ = (uint)bVar22 * auVar68._24_4_ | (uint)!bVar22 * auVar72._24_4_;
                  bVar22 = (bool)((byte)(uVar43 >> 7) & 1);
                  auVar65._28_4_ = (uint)bVar22 * auVar68._28_4_ | (uint)!bVar22 * auVar72._28_4_;
                  auVar65._32_4_ =
                       (uint)(bVar16 & 1) * auVar68._32_4_ |
                       (uint)!(bool)(bVar16 & 1) * auVar72._32_4_;
                  bVar22 = (bool)(bVar16 >> 1 & 1);
                  auVar65._36_4_ = (uint)bVar22 * auVar68._36_4_ | (uint)!bVar22 * auVar72._36_4_;
                  bVar22 = (bool)(bVar16 >> 2 & 1);
                  auVar65._40_4_ = (uint)bVar22 * auVar68._40_4_ | (uint)!bVar22 * auVar72._40_4_;
                  bVar22 = (bool)(bVar16 >> 3 & 1);
                  auVar65._44_4_ = (uint)bVar22 * auVar68._44_4_ | (uint)!bVar22 * auVar72._44_4_;
                  bVar22 = (bool)(bVar16 >> 4 & 1);
                  auVar65._48_4_ = (uint)bVar22 * auVar68._48_4_ | (uint)!bVar22 * auVar72._48_4_;
                  bVar22 = (bool)(bVar16 >> 5 & 1);
                  auVar65._52_4_ = (uint)bVar22 * auVar68._52_4_ | (uint)!bVar22 * auVar72._52_4_;
                  bVar22 = (bool)(bVar16 >> 6 & 1);
                  auVar65._56_4_ = (uint)bVar22 * auVar68._56_4_ | (uint)!bVar22 * auVar72._56_4_;
                  auVar65._60_4_ =
                       (uint)(bVar16 >> 7) * auVar68._60_4_ |
                       (uint)!(bool)(bVar16 >> 7) * auVar72._60_4_;
                  auVar64 = vextractf64x4_avx512f(auVar65,1);
                  auVar65 = vaddps_avx512f(auVar65,ZEXT3264(auVar64));
                  auVar44._0_4_ = auVar65._0_4_ + auVar65._16_4_;
                  auVar44._4_4_ = auVar65._4_4_ + auVar65._20_4_;
                  auVar44._8_4_ = auVar65._8_4_ + auVar65._24_4_;
                  auVar44._12_4_ = auVar65._12_4_ + auVar65._28_4_;
                  auVar8 = vshufpd_avx(auVar44,auVar44,1);
                  auVar71._0_4_ = auVar44._0_4_ + auVar8._0_4_;
                  auVar71._4_4_ = auVar44._4_4_ + auVar8._4_4_;
                  auVar71._8_4_ = auVar44._8_4_ + auVar8._8_4_;
                  auVar71._12_4_ = auVar44._12_4_ + auVar8._12_4_;
                  auVar8 = vhaddps_avx(auVar71,auVar71);
                  fVar70 = auVar8._0_4_;
                }
                auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar70 * local_d8)),ZEXT416((uint)local_f8),
                                         ZEXT416((uint)(pLVar37->super_LRN).bias));
                auVar10._8_4_ = 0x80000000;
                auVar10._0_8_ = 0x8000000080000000;
                auVar10._12_4_ = 0x80000000;
                auVar44 = vxorps_avx512vl(ZEXT416((uint)(pLVar37->super_LRN).beta),auVar10);
                fVar70 = powf(auVar8._0_4_,auVar44._0_4_);
                *(float *)((long)pvVar42 + lVar40 * 4) =
                     fVar70 * *(float *)((long)pvVar42 + lVar40 * 4);
                lVar40 = lVar40 + 1;
                auVar65 = vmovdqu64_avx512f(local_b8);
                auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                pLVar37 = local_1b0;
              } while (lVar40 != CONCAT44(fStack_144,local_148));
            }
            pvVar42 = (void *)((long)pvVar42 + local_1a0 * 4);
            local_1b8 = (Mat *)((long)&local_1b8->data + 1);
          } while (local_1b8 != local_1c0);
        }
        local_1a8 = local_1a8 + 1;
      } while (local_1a8 != local_150);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar17 = (int *)CONCAT44(fStack_1fc,local_208._8_4_);
    if (piVar17 != (int *)0x0) {
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        if (local_1e8 == (Allocator *)0x0) {
          if ((Allocator *)local_208._0_8_ != (Allocator *)0x0) {
            free((void *)local_208._0_8_);
          }
        }
        else {
          (*local_1e8->_vptr_Allocator[3])();
        }
      }
    }
    local_1c8 = 0;
    local_208._0_8_ = (void *)0x0;
    local_208._8_4_ = 0;
    fStack_1fc = 0.0;
    local_1f8 = 0;
    iStack_1f4 = 0;
    local_1f0 = 0;
    iStack_1e0 = 0;
    fStack_1dc = 0.0;
    iStack_1d8 = 0;
    iStack_1d4 = 0;
    iStack_1d0 = 0;
  }
  iVar24 = 0;
LAB_003306e5:
  piVar17 = (int *)CONCAT44(local_198._12_4_,local_198._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_178 == (Allocator *)0x0) {
        if ((Allocator *)local_198._0_8_ != (Allocator *)0x0) {
          free((void *)local_198._0_8_);
        }
      }
      else {
        (*local_178->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int LRN_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}